

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *pcVar1;
  EnumDescriptor *pEVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_80;
  char *local_78;
  ulong local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  ulong local_30;
  long local_28;
  undefined8 local_20;
  char *local_18;
  
  pEVar2 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  pcVar1 = (pEVar2->all_names_).payload_;
  local_70 = (ulong)*(ushort *)(pcVar1 + 2);
  local_48 = **(undefined8 **)(this + 8);
  local_50 = (*(undefined8 **)(this + 8))[1];
  local_30 = (ulong)*(ushort *)(*(long *)(**(long **)this + 8) + 2);
  local_80 = 0xb;
  local_78 = "Enum type \"";
  pieces._M_len = pcVar1 + ~local_70;
  local_60 = 0x16;
  local_58 = "\" has no value named \"";
  local_40 = 0xe;
  local_38 = "\" for option \"";
  local_28 = ~local_30 + *(long *)(**(long **)this + 8);
  local_20 = 2;
  local_18 = "\".";
  pieces._M_array = (iterator)0x7;
  local_68 = pieces._M_len;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_80,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}